

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsView::fitInView(QGraphicsView *this,QRectF *rect,AspectRatioMode aspectRatioMode)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  double *pdVar3;
  int in_EDX;
  QRectF *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  double dVar5;
  QRectF *this_00;
  QGraphicsView *this_01;
  int margin;
  QGraphicsViewPrivate *d;
  qreal yratio;
  qreal xratio;
  QRectF sceneRect;
  QRectF viewRect;
  QRectF unity;
  QAbstractScrollArea *in_stack_fffffffffffffed0;
  QRectF *this_02;
  QRect *in_stack_fffffffffffffed8;
  QRectF *in_stack_fffffffffffffee0;
  QRectF *this_03;
  QWidget *in_stack_fffffffffffffee8;
  QPointF *pos;
  double local_b8;
  double local_b0;
  QRectF local_a8;
  QRect local_88;
  QRect local_78;
  QRectF local_68;
  QRectF local_48;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsView *)0xa39b79);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa39b8f);
  if ((bVar1) && (bVar1 = QRectF::isNull(in_RSI), !bVar1)) {
    local_28.xp = -NAN;
    local_28.yp = -NAN;
    local_28.w = -NAN;
    local_28.h = -NAN;
    pos = (QPointF *)&pQVar2->matrix;
    QRectF::QRectF(&local_48,0.0,0.0,1.0,1.0);
    QTransform::mapRect((QRectF *)&local_28);
    bVar1 = QRectF::isEmpty(&local_28);
    if (!bVar1) {
      qVar4 = QRectF::width(&local_28);
      dVar5 = 1.0 / qVar4;
      QRectF::height(&local_28);
      scale((QGraphicsView *)in_stack_fffffffffffffee8,(qreal)in_stack_fffffffffffffee0,
            (qreal)in_stack_fffffffffffffed8);
      local_68.xp = -NAN;
      local_68.yp = -NAN;
      local_68.w = -NAN;
      local_68.h = -NAN;
      QAbstractScrollArea::viewport(in_stack_fffffffffffffed0);
      local_88 = QWidget::rect(in_stack_fffffffffffffee8);
      local_78 = QRect::adjusted(in_RDI,(int)((ulong)pos >> 0x20),(int)pos,
                                 (int)((ulong)dVar5 >> 0x20),SUB84(dVar5,0));
      QRectF::QRectF(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      bVar1 = QRectF::isEmpty(&local_68);
      if (!bVar1) {
        local_a8.xp = -NAN;
        local_a8.yp = -NAN;
        local_a8.w = -NAN;
        local_a8.h = -NAN;
        QTransform::mapRect((QRectF *)&local_a8);
        bVar1 = QRectF::isEmpty(&local_a8);
        if (!bVar1) {
          this_02 = &local_68;
          this_00 = (QRectF *)QRectF::width(this_02);
          this_03 = &local_a8;
          qVar4 = QRectF::width(this_03);
          local_b0 = (double)this_00 / qVar4;
          this_01 = (QGraphicsView *)QRectF::height(this_02);
          qVar4 = QRectF::height(this_03);
          local_b8 = (double)this_01 / qVar4;
          if (in_EDX != 0) {
            if (in_EDX == 1) {
              pdVar3 = qMin<double>(&local_b0,&local_b8);
              local_b8 = *pdVar3;
              local_b0 = local_b8;
            }
            else if (in_EDX == 2) {
              pdVar3 = qMax<double>(&local_b0,&local_b8);
              local_b8 = *pdVar3;
              local_b0 = local_b8;
            }
          }
          scale(this_01,(qreal)this_03,(qreal)this_00);
          QRectF::center(this_00);
          centerOn((QGraphicsView *)in_RDI,pos);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::fitInView(const QRectF &rect, Qt::AspectRatioMode aspectRatioMode)
{
    Q_D(QGraphicsView);
    if (!d->scene || rect.isNull())
        return;

    // Reset the view scale to 1:1.
    QRectF unity = d->matrix.mapRect(QRectF(0, 0, 1, 1));
    if (unity.isEmpty())
        return;
    scale(1 / unity.width(), 1 / unity.height());

    // Find the ideal x / y scaling ratio to fit \a rect in the view.
    int margin = 2;
    QRectF viewRect = viewport()->rect().adjusted(margin, margin, -margin, -margin);
    if (viewRect.isEmpty())
        return;
    QRectF sceneRect = d->matrix.mapRect(rect);
    if (sceneRect.isEmpty())
        return;
    qreal xratio = viewRect.width() / sceneRect.width();
    qreal yratio = viewRect.height() / sceneRect.height();

    // Respect the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Scale and center on the center of \a rect.
    scale(xratio, yratio);
    centerOn(rect.center());
}